

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_mask_stage_output_by_location(spvc_compiler compiler,uint location,uint component)

{
  spvc_context this;
  spvc_result sVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (compiler->backend == SPVC_BACKEND_NONE) {
    this = compiler->context;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,
               "Cross-compilation related option used on NONE backend which only supports reflection."
               ,"");
    std::__cxx11::string::operator=((string *)this,(string *)local_38);
    if (this->callback != (spvc_error_callback)0x0) {
      (*this->callback)(this->callback_userdata,(this->last_error)._M_dataplus._M_p);
    }
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  else {
    spirv_cross::CompilerGLSL::mask_stage_output_by_location
              ((CompilerGLSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,location,
               component);
    sVar1 = SPVC_SUCCESS;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_mask_stage_output_by_location(spvc_compiler compiler,
                                                        unsigned location, unsigned component)
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend == SPVC_BACKEND_NONE)
	{
		compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	static_cast<CompilerGLSL *>(compiler->compiler.get())->mask_stage_output_by_location(location, component);
	return SPVC_SUCCESS;
#else
	(void)location;
	(void)component;
	compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}